

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O2

Result_Type
chaiscript::
boxed_cast<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const*>
          (Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  bool bVar1;
  Result_Type pvVar2;
  bad_boxed_cast *this;
  undefined1 local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28 [2];
  
  if (t_conversions != (Type_Conversions_State *)0x0) {
    local_30 = (undefined1  [8])
               &std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>_const*
                ::typeinfo;
    local_28[0]._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         &std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::typeinfo;
    local_28[1]._M_pi._0_4_ = 5;
    bVar1 = Type_Info::bare_equal
                      (&((bv->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_type_info,(Type_Info *)local_30);
    if ((!bVar1) &&
       (bVar1 = Type_Conversions::
                convertable_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const*>
                          ((t_conversions->m_conversions)._M_data), bVar1)) {
      bVar1 = Type_Conversions::
              convertable_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const*>
                        ((t_conversions->m_conversions)._M_data);
      if (bVar1) {
        Type_Conversions::
        boxed_type_conversion<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const*>
                  ((Type_Conversions *)local_30,
                   (Conversion_Saves *)(t_conversions->m_conversions)._M_data,
                   (Boxed_Value *)(t_conversions->m_saves)._M_data);
        pvVar2 = detail::
                 Cast_Helper_Inner<const_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_*>
                 ::cast((Boxed_Value *)local_30,t_conversions);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_28);
        return pvVar2;
      }
      this = (bad_boxed_cast *)__cxa_allocate_exception(0x48);
      exception::bad_boxed_cast::bad_boxed_cast
                (this,((bv->m_data).
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_type_info,
                 (type_info *)
                 &std::
                  vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>_const*::
                  typeinfo);
      __cxa_throw(this,&exception::bad_boxed_cast::typeinfo,
                  exception::bad_boxed_cast::~bad_boxed_cast);
    }
  }
  pvVar2 = detail::
           Cast_Helper_Inner<const_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_*>
           ::cast(bv,t_conversions);
  return pvVar2;
}

Assistant:

typename detail::Cast_Helper<Type>::Result_Type boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr)
  {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }


    if (t_conversions && (*t_conversions)->convertable_type<Type>())
    {
      try {
        // std::cout << "trying an up conversion " << typeid(Type).name() << '\n';
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions);
      } catch (...) {
        try {
        //  std::cout << "trying a down conversion " << typeid(Type).name() << '\n';
          // try going the other way - down the inheritance graph
          return detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv), t_conversions);
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not polymorphic, just throw the error, don't waste the time on the 
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }

  }